

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyAuxRef.cpp
# Opt level: O3

void __thiscall chrono::ChBodyAuxRef::ArchiveOUT(ChBodyAuxRef *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChFrameMoving<double>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChBodyAuxRef>(marchive);
  ChBody::ArchiveOUT(&this->super_ChBody,marchive);
  local_38._value = &this->auxref_to_cog;
  local_38._name = "auxref_to_cog";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChFrameMoving<double>>(marchive,&local_38);
  local_38._value = &this->auxref_to_abs;
  local_38._name = "auxref_to_abs";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChFrameMoving<double>>(marchive,&local_38);
  return;
}

Assistant:

void ChBodyAuxRef::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChBodyAuxRef>();

    // serialize parent class
    ChBody::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(auxref_to_cog);
    marchive << CHNVP(auxref_to_abs);
}